

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O0

void duckdb::UnionVector::SetToMember
               (Vector *union_vector,union_tag_t tag,Vector *member_vector,idx_t count,
               bool keep_tags_for_null)

{
  VectorType VVar1;
  bool bVar2;
  Vector *vector;
  VectorType *pVVar3;
  uchar *__s;
  Vector *pVVar4;
  Vector *pVVar5;
  size_t in_RCX;
  Vector *in_RDX;
  VectorType in_SIL;
  Vector *in_RDI;
  byte in_R8B;
  Vector *member;
  idx_t i;
  uchar *tag_data_1;
  uchar *tag_data;
  Vector *tag_vector;
  idx_t in_stack_00000328;
  Vector *in_stack_00000330;
  ValidityMask *in_stack_ffffffffffffff78;
  Vector *in_stack_ffffffffffffff80;
  idx_t in_stack_ffffffffffffff98;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffffa0;
  VectorType in_stack_ffffffffffffffaf;
  Vector *in_stack_ffffffffffffffb0;
  Vector *local_48;
  Vector *in_stack_ffffffffffffffc8;
  Vector *in_stack_ffffffffffffffd0;
  
  GetMember(in_stack_ffffffffffffff80,(idx_t)in_stack_ffffffffffffff78);
  Vector::Reference(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  vector = GetTags((Vector *)0x3e6345);
  VVar1 = Vector::GetVectorType(in_RDX);
  if (VVar1 == CONSTANT_VECTOR) {
    Vector::SetVectorType(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffaf);
    in_stack_ffffffffffffffaf = in_SIL;
    pVVar3 = ConstantVector::GetData<unsigned_char>((Vector *)0x3e6380);
    *pVVar3 = in_stack_ffffffffffffffaf;
    if ((in_R8B & 1) == 0) {
      ConstantVector::IsNull((Vector *)0x3e63c1);
      ConstantVector::SetNull(vector,SUB81((ulong)in_stack_ffffffffffffffc8 >> 0x38,0));
      ConstantVector::IsNull((Vector *)0x3e63e5);
      ConstantVector::SetNull(vector,SUB81((ulong)in_stack_ffffffffffffffc8 >> 0x38,0));
    }
    else {
      ConstantVector::SetNull(vector,SUB81((ulong)in_stack_ffffffffffffffc8 >> 0x38,0));
      ConstantVector::SetNull(vector,SUB81((ulong)in_stack_ffffffffffffffc8 >> 0x38,0));
    }
  }
  else {
    Vector::Flatten(in_stack_00000330,in_stack_00000328);
    Vector::SetVectorType(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffaf);
    bVar2 = TemplatedValidityMask<unsigned_long>::AllValid
                      (&(in_RDX->validity).super_TemplatedValidityMask<unsigned_long>);
    if (bVar2) {
      Vector::SetVectorType(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffaf);
      in_stack_ffffffffffffffc8 =
           (Vector *)ConstantVector::GetData<unsigned_char>((Vector *)0x3e6445);
      in_stack_ffffffffffffffc8->vector_type = in_SIL;
    }
    else {
      Vector::SetVectorType(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffaf);
      if ((in_R8B & 1) == 0) {
        FlatVector::Validity((Vector *)0x3e64aa);
        FlatVector::Validity((Vector *)0x3e64bc);
        ValidityMask::operator=((ValidityMask *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78)
        ;
        FlatVector::Validity((Vector *)0x3e64d3);
        FlatVector::Validity((Vector *)0x3e64e2);
        ValidityMask::operator=((ValidityMask *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78)
        ;
      }
      else {
        FlatVector::Validity((Vector *)0x3e6477);
        TemplatedValidityMask<unsigned_long>::SetAllValid
                  (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        FlatVector::Validity((Vector *)0x3e6491);
        TemplatedValidityMask<unsigned_long>::SetAllValid
                  (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      }
      __s = FlatVector::GetData<unsigned_char>((Vector *)0x3e64f9);
      memset(__s,(uint)in_SIL,in_RCX);
    }
  }
  local_48 = (Vector *)0x0;
  while( true ) {
    pVVar5 = local_48;
    Vector::GetType(in_RDI);
    pVVar4 = (Vector *)UnionType::GetMemberCount((LogicalType *)0x3e653f);
    if (pVVar4 <= pVVar5) break;
    if (local_48 != (Vector *)(ulong)in_SIL) {
      pVVar5 = GetMember(pVVar5,(idx_t)in_stack_ffffffffffffff78);
      Vector::SetVectorType(pVVar5,in_stack_ffffffffffffffaf);
      ConstantVector::SetNull(vector,SUB81((ulong)in_stack_ffffffffffffffc8 >> 0x38,0));
    }
    local_48 = (Vector *)&local_48->field_0x1;
  }
  return;
}

Assistant:

void UnionVector::SetToMember(Vector &union_vector, union_tag_t tag, Vector &member_vector, idx_t count,
                              bool keep_tags_for_null) {
	D_ASSERT(union_vector.GetType().id() == LogicalTypeId::UNION);
	D_ASSERT(tag < UnionType::GetMemberCount(union_vector.GetType()));

	// Set the union member to the specified vector
	UnionVector::GetMember(union_vector, tag).Reference(member_vector);
	auto &tag_vector = UnionVector::GetTags(union_vector);

	if (member_vector.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		// if the member vector is constant, we can set the union to constant as well
		union_vector.SetVectorType(VectorType::CONSTANT_VECTOR);
		ConstantVector::GetData<union_tag_t>(tag_vector)[0] = tag;
		if (keep_tags_for_null) {
			ConstantVector::SetNull(union_vector, false);
			ConstantVector::SetNull(tag_vector, false);
		} else {
			ConstantVector::SetNull(union_vector, ConstantVector::IsNull(member_vector));
			ConstantVector::SetNull(tag_vector, ConstantVector::IsNull(member_vector));
		}

	} else {
		// otherwise flatten and set to flatvector
		member_vector.Flatten(count);
		union_vector.SetVectorType(VectorType::FLAT_VECTOR);

		if (member_vector.validity.AllValid()) {
			// if the member vector is all valid, we can set the tag to constant
			tag_vector.SetVectorType(VectorType::CONSTANT_VECTOR);
			auto tag_data = ConstantVector::GetData<union_tag_t>(tag_vector);
			*tag_data = tag;
		} else {
			tag_vector.SetVectorType(VectorType::FLAT_VECTOR);
			if (keep_tags_for_null) {
				FlatVector::Validity(tag_vector).SetAllValid(count);
				FlatVector::Validity(union_vector).SetAllValid(count);
			} else {
				// ensure the tags have the same validity as the member
				FlatVector::Validity(union_vector) = FlatVector::Validity(member_vector);
				FlatVector::Validity(tag_vector) = FlatVector::Validity(member_vector);
			}

			auto tag_data = FlatVector::GetData<union_tag_t>(tag_vector);
			memset(tag_data, tag, count);
		}
	}

	// Set the non-selected members to constant null vectors
	for (idx_t i = 0; i < UnionType::GetMemberCount(union_vector.GetType()); i++) {
		if (i != tag) {
			auto &member = UnionVector::GetMember(union_vector, i);
			member.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(member, true);
		}
	}
}